

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

int b_array::first_ge<MultiMap::Pair<std::__cxx11::string,std::__cxx11::string>>
              (Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *data,size_t size,
              Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *entry)

{
  int iVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar2;
  size_t unaff_R14;
  bool bVar3;
  
  bVar3 = size != 0;
  if (bVar3) {
    unaff_R14 = 0;
    do {
      pPVar2 = Array<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](data,unaff_R14);
      iVar1 = std::__cxx11::string::compare((string *)pPVar2);
      if (-1 < iVar1) break;
      unaff_R14 = unaff_R14 + 1;
      bVar3 = unaff_R14 < size;
    } while (unaff_R14 != size);
  }
  iVar1 = (int)size;
  if (bVar3) {
    iVar1 = (int)unaff_R14;
  }
  return iVar1;
}

Assistant:

int first_ge(const b_array::Array<T>& data, size_t size, const T& entry) {
    for (size_t i = 0; i < size; i++) {
        if (data[i] >= entry) {
            return i;
        }
    }
    return size;
}